

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::Framebuffers::CheckStatusTest::IncompleteMultisampleTextureTestCase
          (CheckStatusTest *this)

{
  ostringstream *this_00;
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  int iVar4;
  undefined4 extraout_var;
  int *piVar6;
  bool bVar7;
  GLuint rbo;
  GLuint fbo;
  GLuint to [2];
  int local_1c8;
  int local_1c4;
  undefined8 local_1c0;
  Enum<int,_2UL> local_1b8;
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  long lVar5;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  local_1c4 = 0;
  local_1c8 = 0;
  local_1c0 = 0;
  (**(code **)(lVar5 + 0x6d0))(1);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glGenFramebuffers has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0xd8d);
  (**(code **)(lVar5 + 0x78))(0x8d40,local_1c4);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glBindFramebuffers has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0xd90);
  (**(code **)(lVar5 + 0x6f8))(2,&local_1c0);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glGenTextures has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0xd93);
  (**(code **)(lVar5 + 0xb8))(0x9100,local_1c0 & 0xffffffff);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glBindTexture has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0xd96);
  (**(code **)(lVar5 + 0x1390))(0x9100,2,0x8229,1,1,0);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glTexStorage2DMultisample has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0xd99);
  (**(code **)(lVar5 + 0x690))(0x8d40,0x8ce0,local_1c0 & 0xffffffff,0);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glFramebufferRenderbuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0xd9c);
  (**(code **)(lVar5 + 0xb8))(0x9100,local_1c0._4_4_);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glBindTexture has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0xd9f);
  (**(code **)(lVar5 + 0x1390))(0x9100,4,0x8229,1,1,1);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glTexStorage2DMultisample has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0xda2);
  (**(code **)(lVar5 + 0x690))(0x8d40,0x8ce1,local_1c0._4_4_,0);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glFramebufferRenderbuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0xda5);
  (**(code **)(lVar5 + 0x6e8))(1,&local_1c8);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glGenRenderbuffers has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0xda8);
  (**(code **)(lVar5 + 0xa0))(0x8d41,local_1c8);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glBindRenderbuffers has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0xdab);
  (**(code **)(lVar5 + 0x1240))(0x8d41,1,0x8229,1,1);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glRenderbufferStorage has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0xdae);
  (**(code **)(lVar5 + 0x688))(0x8d40,0x8ce2,0x8d41,local_1c8);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glFramebufferRenderbuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0xdb1);
  (**(code **)(lVar5 + 0x78))(0x8d40,0);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glBindFramebuffers has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0xdb4);
  iVar2 = (**(code **)(lVar5 + 0x178))(local_1c4,0x8d40);
  if (iVar2 != 0x8d56) {
    local_1a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,
               "CheckNamedFramebufferStatus did not return FRAMEBUFFER_INCOMPLETE_MULTISAMPLE value. "
               ,0x55);
    local_1b8.m_getName = glu::getFramebufferStatusName;
    local_1b8.m_value = iVar2;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1b8,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00," was observed instead.",0x16);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_130);
  }
  if (local_1c4 != 0) {
    (**(code **)(lVar5 + 0x440))(1,&local_1c4);
  }
  piVar6 = (int *)&local_1c0;
  bVar1 = true;
  do {
    bVar7 = bVar1;
    if (*piVar6 != 0) {
      (**(code **)(lVar5 + 0x480))(1);
    }
    piVar6 = (int *)((long)&local_1c0 + 4);
    bVar1 = false;
  } while (bVar7);
  if (local_1c8 != 0) {
    (**(code **)(lVar5 + 0x460))(1,&local_1c8);
  }
  do {
    iVar4 = (**(code **)(lVar5 + 0x800))();
  } while (iVar4 != 0);
  return iVar2 == 0x8d56;
}

Assistant:

bool CheckStatusTest::IncompleteMultisampleTextureTestCase()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Test result */
	bool is_ok	= true;
	bool is_error = false;

	/* Test objects. */
	glw::GLuint fbo   = 0;
	glw::GLuint rbo   = 0;
	glw::GLuint to[2] = { 0 };

	try
	{
		gl.genFramebuffers(1, &fbo);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers has failed");

		gl.bindFramebuffer(GL_FRAMEBUFFER, fbo);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffers has failed");

		gl.genTextures(2, to);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

		gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE, to[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture has failed");

		gl.texStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, 2, GL_R8, 1, 1, GL_FALSE);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage2DMultisample has failed");

		gl.framebufferTexture(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, to[0], 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferRenderbuffer has failed");

		gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE, to[1]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture has failed");

		gl.texStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, 4, GL_R8, 1, 1, GL_TRUE);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage2DMultisample has failed");

		gl.framebufferTexture(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT1, to[1], 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferRenderbuffer has failed");

		gl.genRenderbuffers(1, &rbo);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenRenderbuffers has failed");

		gl.bindRenderbuffer(GL_RENDERBUFFER, rbo);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindRenderbuffers has failed");

		gl.renderbufferStorageMultisample(GL_RENDERBUFFER, 1, GL_R8, 1, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glRenderbufferStorage has failed");

		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT2, GL_RENDERBUFFER, rbo);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferRenderbuffer has failed");

		gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffers has failed");

		glw::GLenum status = 0;

		/* Check that framebuffer is complete. */
		if (GL_FRAMEBUFFER_INCOMPLETE_MULTISAMPLE != (status = gl.checkNamedFramebufferStatus(fbo, GL_FRAMEBUFFER)))
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "CheckNamedFramebufferStatus did not return FRAMEBUFFER_INCOMPLETE_MULTISAMPLE value. "
				<< glu::getFramebufferStatusStr(status) << " was observed instead." << tcu::TestLog::EndMessage;

			is_ok = false;
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Releasing obnjects. */
	if (fbo)
	{
		gl.deleteFramebuffers(1, &fbo);
	}

	for (glw::GLuint i = 0; i < 2; ++i)
	{
		if (to[i])
		{
			gl.deleteTextures(1, &to[i]);
		}
	}

	if (rbo)
	{
		gl.deleteRenderbuffers(1, &rbo);
	}

	if (is_error)
	{
		throw 0;
	}

	/* Errors clean up. */
	while (gl.getError())
		;

	return is_ok;
}